

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_test_result.hpp
# Opt level: O0

void __thiscall
hayai::TestResult::TestResult
          (TestResult *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *runTimes,
          size_t iterations)

{
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  bool bVar4;
  unsigned_long uVar5;
  reference puVar6;
  size_type sVar7;
  long lVar8;
  iterator __first;
  iterator __last;
  ulong __n;
  ulong __n_00;
  reference pvVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t quartile;
  size_t sortedSizeHalf;
  size_t sortedSize;
  undefined1 local_90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedRunTimes;
  double diff;
  uint64_t run_1;
  unsigned_long *local_60;
  double local_58;
  double accu;
  double mean;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long local_38;
  uint64_t run;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  iterator runIt;
  size_t iterations_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *runTimes_local;
  TestResult *this_local;
  
  runIt._M_current = (unsigned_long *)iterations;
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_runTimes,runTimes);
  this->_iterations = (size_t)runIt._M_current;
  this->_timeTotal = 0;
  uVar5 = inja::std::numeric_limits<unsigned_long>::max();
  this->_timeRunMin = uVar5;
  uVar5 = inja::std::numeric_limits<unsigned_long>::min();
  this->_timeRunMax = uVar5;
  this->_timeStdDev = 0.0;
  this->_timeMedian = 0.0;
  this->_timeQuartile1 = 0.0;
  this->_timeQuartile3 = 0.0;
  local_28._M_current =
       (unsigned_long *)
       inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->_runTimes);
  while( true ) {
    run = (uint64_t)
          inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->_runTimes);
    bVar3 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&run);
    if (!bVar3) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_28);
    local_38 = *puVar6;
    this->_timeTotal = local_38 + this->_timeTotal;
    local_40._M_current =
         (unsigned_long *)
         inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->_runTimes);
    bVar4 = __gnu_cxx::operator==(&local_28,&local_40);
    bVar3 = true;
    if (!bVar4) {
      bVar3 = this->_timeRunMax < local_38;
    }
    if (bVar3) {
      this->_timeRunMax = local_38;
    }
    mean = (double)inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (&this->_runTimes);
    bVar4 = __gnu_cxx::operator==
                      (&local_28,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&mean);
    bVar3 = true;
    if (!bVar4) {
      bVar3 = local_38 < this->_timeRunMin;
    }
    if (bVar3) {
      this->_timeRunMin = local_38;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_28);
  }
  accu = RunTimeAverage(this);
  local_58 = 0.0;
  local_60 = (unsigned_long *)
             inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&this->_runTimes);
  local_28._M_current = local_60;
  while( true ) {
    run_1 = (uint64_t)
            inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->_runTimes);
    bVar3 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&run_1);
    dVar10 = local_58;
    if (!bVar3) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_28);
    uVar5 = *puVar6;
    auVar11._8_4_ = (int)(uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) - accu);
    local_58 = (double)sortedRunTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage *
               (double)sortedRunTimes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + local_58;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_28);
  }
  sVar7 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->_runTimes);
  lVar8 = sVar7 - 1;
  auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar19._0_8_ = lVar8;
  auVar19._12_4_ = 0x45300000;
  dVar10 = sqrt(dVar10 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
  this->_timeStdDev = dVar10;
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,&this->_runTimes);
  __first = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  __last = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  sVar7 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  __n = sVar7 >> 1;
  if (sVar7 < 2) {
    if (sVar7 != 0) {
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,0);
      vVar1 = *pvVar9;
      auVar18._8_4_ = (int)(vVar1 >> 0x20);
      auVar18._0_8_ = vVar1;
      auVar18._12_4_ = 0x45300000;
      this->_timeQuartile1 =
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      this->_timeQuartile3 = this->_timeQuartile1;
    }
  }
  else {
    __n_00 = sVar7 >> 2;
    if ((sVar7 & 1) == 0) {
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,__n - 1)
      ;
      vVar1 = *pvVar9;
      auVar12._8_4_ = (int)(vVar1 >> 0x20);
      auVar12._0_8_ = vVar1;
      auVar12._12_4_ = 0x45300000;
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,__n);
      vVar2 = *pvVar9;
      auVar20._8_4_ = (int)(vVar2 >> 0x20);
      auVar20._0_8_ = vVar2;
      auVar20._12_4_ = 0x45300000;
      this->_timeMedian =
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0) +
           (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0)) * 0.5;
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,__n_00);
      vVar1 = *pvVar9;
      auVar13._8_4_ = (int)(vVar1 >> 0x20);
      auVar13._0_8_ = vVar1;
      auVar13._12_4_ = 0x45300000;
      this->_timeQuartile1 =
           (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          __n + __n_00);
      vVar1 = *pvVar9;
      auVar14._8_4_ = (int)(vVar1 >> 0x20);
      auVar14._0_8_ = vVar1;
      auVar14._12_4_ = 0x45300000;
      this->_timeQuartile3 =
           (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
    }
    else {
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,__n);
      vVar1 = *pvVar9;
      auVar15._8_4_ = (int)(vVar1 >> 0x20);
      auVar15._0_8_ = vVar1;
      auVar15._12_4_ = 0x45300000;
      this->_timeMedian =
           (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          __n_00 - 1);
      vVar1 = *pvVar9;
      auVar16._8_4_ = (int)(vVar1 >> 0x20);
      auVar16._0_8_ = vVar1;
      auVar16._12_4_ = 0x45300000;
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,__n_00);
      vVar2 = *pvVar9;
      auVar21._8_4_ = (int)(vVar2 >> 0x20);
      auVar21._0_8_ = vVar2;
      auVar21._12_4_ = 0x45300000;
      this->_timeQuartile1 =
           ((auVar16._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0) +
           (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0)) * 0.5;
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          (__n_00 - 1) + __n);
      vVar1 = *pvVar9;
      auVar17._8_4_ = (int)(vVar1 >> 0x20);
      auVar17._0_8_ = vVar1;
      auVar17._12_4_ = 0x45300000;
      pvVar9 = inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          __n + __n_00);
      vVar2 = *pvVar9;
      auVar22._8_4_ = (int)(vVar2 >> 0x20);
      auVar22._0_8_ = vVar2;
      auVar22._12_4_ = 0x45300000;
      this->_timeQuartile3 =
           ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0) +
           (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0)) / 2.0;
    }
  }
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  return;
}

Assistant:

TestResult(const std::vector<uint64_t>& runTimes,
                   std::size_t iterations)
            :   _runTimes(runTimes),
                _iterations(iterations),
                _timeTotal(0),
                _timeRunMin(std::numeric_limits<uint64_t>::max()),
                _timeRunMax(std::numeric_limits<uint64_t>::min()),
                _timeStdDev(0.0),
                _timeMedian(0.0),
                _timeQuartile1(0.0),
                _timeQuartile3(0.0)
        {
            // Summarize under the assumption of values being accessed more
            // than once.
            std::vector<uint64_t>::iterator runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;

                _timeTotal += run;
                if ((runIt == _runTimes.begin()) || (run > _timeRunMax))
                    _timeRunMax = run;
                if ((runIt == _runTimes.begin()) || (run < _timeRunMin))
                    _timeRunMin = run;

                ++runIt;
            }

            // Calculate standard deviation.
            const double mean = RunTimeAverage();
            double accu = 0.0;

            runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;
                const double diff = double(run) - mean;
                accu += (diff * diff);

                ++runIt;
            }

            _timeStdDev = std::sqrt(accu / (_runTimes.size() - 1));

            // Calculate quartiles.
            std::vector<uint64_t> sortedRunTimes(_runTimes);
            std::sort(sortedRunTimes.begin(), sortedRunTimes.end());

            const std::size_t sortedSize = sortedRunTimes.size();
            const std::size_t sortedSizeHalf = sortedSize / 2;

            if (sortedSize >= 2)
            {
                const std::size_t quartile = sortedSizeHalf / 2;

                if ((sortedSize % 2) == 0)
                {
                    _timeMedian =
                        (double(sortedRunTimes[sortedSizeHalf - 1]) +
                         double(sortedRunTimes[sortedSizeHalf])) / 2;

                    _timeQuartile1 =
                        double(sortedRunTimes[quartile]);
                    _timeQuartile3 =
                        double(sortedRunTimes[sortedSizeHalf + quartile]);
                }
                else
                {
                    _timeMedian = double(sortedRunTimes[sortedSizeHalf]);

                    _timeQuartile1 =
                        (double(sortedRunTimes[quartile - 1]) +
                         double(sortedRunTimes[quartile])) / 2;
                    _timeQuartile3 = (
                        double(
                            sortedRunTimes[sortedSizeHalf + (quartile - 1)]
                        ) +
                        double(
                            sortedRunTimes[sortedSizeHalf + quartile]
                        )
                    ) / 2;
                }
            }
            else if (sortedSize > 0)
            {
                _timeQuartile1 = double(sortedRunTimes[0]);
                _timeQuartile3 = _timeQuartile1;
            }
        }